

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O3

void __thiscall QtMWidgets::MsgBoxButton::paintEvent(MsgBoxButton *this,QPaintEvent *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  MsgBoxButtonPrivate *pMVar3;
  long lVar4;
  ColorGroup CVar5;
  long *plVar6;
  QPainter p;
  QColor c;
  undefined1 auStack_58 [8];
  qreal local_50;
  qreal local_48;
  QString local_38;
  double dStack_20;
  
  QPainter::QPainter((QPainter *)auStack_58,(QPaintDevice *)&this->field_0x10);
  CVar5 = QWidget::palette();
  QPalette::brush(CVar5,Dark);
  QPainter::setPen((QColor *)auStack_58);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  uVar1 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x1c);
  uVar2 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x14);
  local_38.d.size = (qsizetype)(double)(((int)uVar1 - (int)uVar2) + 1);
  dStack_20 = (double)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1);
  pMVar3 = (this->d).d;
  QTextOption::QTextOption((QTextOption *)&local_50,0x84);
  QPainter::drawText((QRectF *)auStack_58,&local_38,(QTextOption *)&pMVar3->text);
  QTextOption::~QTextOption((QTextOption *)&local_50);
  if (((this->d).d)->pressed == true) {
    CVar5 = QWidget::palette();
    plVar6 = (long *)QPalette::brush(CVar5,Dark);
    local_38.d.d = *(Data **)(*plVar6 + 8);
    local_38.d.ptr = *(char16_t **)(*plVar6 + 0x10);
    QColor::setAlpha((int)&local_38);
    QPainter::setPen((PenStyle)auStack_58);
    QBrush::QBrush((QBrush *)&local_50,(QColor *)&local_38,SolidPattern);
    QPainter::setBrush((QBrush *)auStack_58);
    QBrush::~QBrush((QBrush *)&local_50);
    lVar4 = *(long *)&this->field_0x20;
    local_48 = (qreal)CONCAT44(*(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18),
                               *(int *)(lVar4 + 0x1c) - *(int *)(lVar4 + 0x14));
    local_50 = 0.0;
    QPainter::drawRects((QRect *)auStack_58,(int)&local_50);
  }
  QPainter::~QPainter((QPainter *)auStack_58);
  return;
}

Assistant:

void
MsgBoxButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	p.setPen( palette().color( QPalette::WindowText ) );

	p.drawText( rect(), d->text, QTextOption( Qt::AlignCenter ) );

	if( d->pressed )
	{
		QColor c = palette().color( QPalette::Highlight );
		c.setAlpha( 75 );

		p.setPen( Qt::NoPen );
		p.setBrush( c );
		p.drawRect( rect() );
	}
}